

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_vec.cpp
# Opt level: O0

vec_3d unit_vec(vec_3d *a)

{
  vec_3d vVar1;
  ostream *poVar2;
  float *in_RDI;
  float fVar3;
  float norm;
  vec_3d result;
  vec_3d *in_stack_ffffffffffffffd0;
  float local_c;
  float fStack_8;
  float local_4;
  
  fVar3 = operator~(in_stack_ffffffffffffffd0);
  memset(&local_c,0,0xc);
  if (1e-09 <= ABS(fVar3)) {
    if ((fVar3 != 1.0) || (NAN(fVar3))) {
      local_c = *in_RDI / fVar3;
      fStack_8 = in_RDI[1] / fVar3;
      local_4 = in_RDI[2] / fVar3;
    }
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"unit_vec");
    std::operator<<(poVar2,": Division by zero.");
  }
  vVar1.y = fStack_8;
  vVar1.x = local_c;
  vVar1.z = local_4;
  return vVar1;
}

Assistant:

vec_3d unit_vec(const vec_3d *a) {
    float norm = ~(*a);
    vec_3d result = {0.f};

    if (fabsf(norm) < LIBQUAT_EPSILON) {
        std::cerr << __func__ << ": Division by zero.";
        return result;
    }

    if (norm != 1.F)  // perform division only if needed
    {
        result.x = a->x / norm;
        result.y = a->y / norm;
        result.z = a->z / norm;
    }

    return result;
}